

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

void __thiscall Hair_WhiteFurnace_Test::TestBody(Hair_WhiteFurnace_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  char *in_R9;
  uint uVar9;
  int i;
  ulong uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  Float FVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [56];
  float beta_n;
  undefined1 auVar20 [16];
  undefined1 auVar22 [56];
  undefined4 in_XMM5_Da;
  undefined4 in_XMM5_Db;
  undefined8 in_XMM5_Qb;
  Vector3f wo;
  Vector3f wi;
  SampledSpectrum SVar23;
  Float invBase_1;
  Float invBase;
  SampledSpectrum f;
  SampledWavelengths lambda;
  HairBxDF hair;
  float local_114;
  SampledSpectrum local_108;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  SampledSpectrum local_b0;
  undefined1 local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98 [3];
  char *local_80 [2];
  long local_70 [8];
  undefined1 auVar18 [64];
  undefined1 auVar21 [64];
  
  local_e4 = 0.5;
  local_f0 = 0.33333334;
  local_e8 = 0.2;
  local_ec = 0.14285715;
  local_114 = 0.1;
  do {
    beta_n = 0.1;
    do {
      uVar9 = 20000;
      if (beta_n < 0.5) {
        uVar9 = 100000;
      }
      if (local_114 < 0.5) {
        uVar9 = 100000;
      }
      fVar13 = 0.0;
      uVar10 = 0;
      do {
        local_dc = fVar13;
        if (uVar10 == 0) {
          pbrt::SampledWavelengths::SampleXYZ((SampledWavelengths *)local_a0,0.0);
LAB_0026a91d:
          auVar17 = ZEXT816(0) << 0x40;
        }
        else {
          lVar8 = 0;
          fVar13 = 1.0;
          uVar7 = uVar10;
          do {
            lVar8 = (lVar8 - uVar7 / 2) * 2 + uVar7;
            fVar13 = local_e4 * fVar13;
            bVar11 = 1 < uVar7;
            uVar7 = uVar7 / 2;
          } while (bVar11);
          auVar17._4_4_ = in_XMM5_Db;
          auVar17._0_4_ = in_XMM5_Da;
          auVar17._8_8_ = in_XMM5_Qb;
          auVar17 = vcvtusi2ss_avx512f(auVar17,lVar8);
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                               ZEXT416((uint)(fVar13 * auVar17._0_4_)));
          pbrt::SampledWavelengths::SampleXYZ((SampledWavelengths *)local_a0,auVar17._0_4_);
          if (uVar10 == 0) goto LAB_0026a91d;
          lVar8 = 0;
          fVar13 = 1.0;
          uVar7 = uVar10;
          do {
            lVar8 = (lVar8 - uVar7 / 3) * 3 + uVar7;
            fVar13 = local_f0 * fVar13;
            bVar11 = 2 < uVar7;
            uVar7 = uVar7 / 3;
          } while (bVar11);
          auVar12._4_4_ = in_XMM5_Db;
          auVar12._0_4_ = in_XMM5_Da;
          auVar12._8_8_ = in_XMM5_Qb;
          auVar17 = vcvtusi2ss_avx512f(auVar12,lVar8);
          auVar17 = ZEXT416((uint)(fVar13 * auVar17._0_4_));
        }
        local_108.values.values._0_8_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_108.values.values[2] = 0.0;
        local_108.values.values[3] = 0.0;
        auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar17);
        auVar16._0_8_ = (double)auVar17._0_4_;
        auVar16._8_8_ = auVar17._8_8_;
        auVar12 = vfmadd132sd_fma(auVar16,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
        auVar17 = vminsd_avx(ZEXT816(0x3feffffde7210be9),auVar12);
        uVar2 = vcmpsd_avx512f(auVar12,ZEXT816(0xbfeffffde7210be9),1);
        bVar11 = (bool)((byte)uVar2 & 1);
        auVar6._12_4_ = 0;
        auVar6._0_12_ = local_d8._4_12_;
        local_d8 = auVar6 << 0x20;
        pbrt::HairBxDF::HairBxDF
                  ((HairBxDF *)local_80,
                   (float)(double)((ulong)bVar11 * -0x4010000218def417 +
                                  (ulong)!bVar11 * auVar17._0_8_),1.55,&local_108,local_114,beta_n,
                   0.0);
        auVar17 = ZEXT816(0) << 0x40;
        if (uVar10 != 0) {
          lVar8 = 0;
          fVar13 = 1.0;
          uVar7 = uVar10;
          do {
            lVar8 = (lVar8 - uVar7 / 5) * 5 + uVar7;
            fVar13 = local_e8 * fVar13;
            bVar11 = 4 < uVar7;
            uVar7 = uVar7 / 5;
          } while (bVar11);
          auVar4._4_4_ = in_XMM5_Db;
          auVar4._0_4_ = in_XMM5_Da;
          auVar4._8_8_ = in_XMM5_Qb;
          auVar17 = vcvtusi2ss_avx512f(auVar4,lVar8);
          auVar17 = ZEXT416((uint)(fVar13 * auVar17._0_4_));
        }
        if (uVar10 != 0) {
          lVar8 = 0;
          fVar13 = 1.0;
          uVar7 = uVar10;
          do {
            lVar8 = (lVar8 - uVar7 / 7) * 7 + uVar7;
            fVar13 = local_ec * fVar13;
            bVar11 = 6 < uVar7;
            uVar7 = uVar7 / 7;
          } while (bVar11);
          auVar5._4_4_ = in_XMM5_Db;
          auVar5._0_4_ = in_XMM5_Da;
          auVar5._8_8_ = in_XMM5_Qb;
          auVar12 = vcvtusi2ss_avx512f(auVar5,lVar8);
          local_d8._0_4_ = fVar13 * auVar12._0_4_;
        }
        auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar17);
        local_c8 = vfmadd132ss_fma(auVar17,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
        auVar17 = vfnmadd213ss_fma(local_c8,local_c8,SUB6416(ZEXT464(0x3f800000),0));
        auVar17 = vmaxss_avx(auVar17,ZEXT816(0));
        if (auVar17._0_4_ < 0.0) {
          fVar13 = sqrtf(auVar17._0_4_);
        }
        else {
          auVar17 = vsqrtss_avx(auVar17,auVar17);
          fVar13 = auVar17._0_4_;
        }
        auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)local_d8._0_4_));
        local_e0 = auVar17._0_4_ * 6.2831855;
        fVar14 = cosf(local_e0);
        local_d8 = ZEXT416((uint)(fVar14 * fVar13));
        fVar14 = sinf(local_e0);
        auVar17 = vinsertps_avx(local_d8,ZEXT416((uint)(fVar14 * fVar13)),0x10);
        wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.83457476;
        wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.54986966;
        wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.03359017;
        auVar22 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
        auVar19 = ZEXT856(0);
        wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar17._0_8_;
        wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_c8._0_4_;
        SVar23 = pbrt::HairBxDF::f((HairBxDF *)local_80,wo,wi,Radiance);
        auVar21._0_8_ = SVar23.values.values._8_8_;
        auVar21._8_56_ = auVar22;
        auVar18._0_8_ = SVar23.values.values._0_8_;
        auVar18._8_56_ = auVar19;
        auVar17 = vmovlhps_avx(auVar18._0_16_,auVar21._0_16_);
        auVar20._4_4_ = local_c8._0_4_;
        auVar20._0_4_ = local_c8._0_4_;
        auVar20._8_4_ = local_c8._0_4_;
        auVar20._12_4_ = local_c8._0_4_;
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        auVar12 = vandps_avx512vl(auVar20,auVar3);
        local_b0.values.values[0] = auVar12._0_4_ * auVar17._0_4_;
        local_b0.values.values[1] = auVar12._4_4_ * auVar17._4_4_;
        local_b0.values.values[2] = auVar12._8_4_ * auVar17._8_4_;
        local_b0.values.values[3] = auVar12._12_4_ * auVar17._12_4_;
        FVar15 = pbrt::SampledSpectrum::y(&local_b0,(SampledWavelengths *)local_a0);
        fVar13 = local_dc + FVar15;
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
      local_c8._0_8_ = (undefined8)(fVar13 / ((float)uVar9 * 0.07957747));
      local_c8._8_8_ = 0;
      uVar2 = vcmppd_avx512vl(ZEXT816(0x3fee666666666666),local_c8,2);
      uVar1 = vcmppd_avx512vl(local_c8,ZEXT816(0x3ff0cccccccccccd),2);
      local_a0[0] = (internal)((byte)uVar2 & 3 & (byte)uVar1 & 1);
      local_98[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_108);
        std::ostream::_M_insert<double>((double)local_c8._0_8_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)local_a0,
                   (AssertionResult *)"avg >= .95 && avg <= 1.05","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp"
                   ,0x2a3,local_80[0]);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if ((float *)local_80[0] != (float *)((long)&((HairBxDF *)local_80)->sigma_a + 4U)) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_108.values.values._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar11 = testing::internal::IsTrue(true);
          if ((bVar11) &&
             ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_108.values.values._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_108.values.values._0_8_ + 8))();
          }
          local_108.values.values._0_8_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      beta_n = beta_n + 0.2;
    } while (beta_n < 1.0);
    local_114 = local_114 + 0.2;
    if (1.0 <= local_114) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Hair, WhiteFurnace) {
    RNG rng;
    Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    for (Float beta_m = .1; beta_m < 1; beta_m += .2) {
        for (Float beta_n = .1; beta_n < 1; beta_n += .2) {
            // Estimate reflected uniform incident radiance from hair
            Float ySum = 0;

            // More samples for the smooth case, since we're sampling blindly.
            int count = (beta_m < .5 || beta_n < .5) ? 100000 : 20000;

            for (int i = 0; i < count; ++i) {
                SampledWavelengths lambda =
                    SampledWavelengths::SampleXYZ(RadicalInverse(0, i));

                Float h = Clamp(-1 + 2. * RadicalInverse(1, i), -.999999, .999999);
                SampledSpectrum sigma_a(0.f);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);
                Vector3f wi =
                    SampleUniformSphere({RadicalInverse(2, i), RadicalInverse(3, i)});

                SampledSpectrum f =
                    hair.f(wo, wi, TransportMode::Radiance) * AbsCosTheta(wi);
                ySum += f.y(lambda);
            }

            Float avg = ySum / (count * UniformSpherePDF());
            EXPECT_TRUE(avg >= .95 && avg <= 1.05) << avg;
        }
    }
}